

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

Identifier __thiscall
soul::BlockBuilder::createIdentifier(BlockBuilder *this,char *prefix,uint32_t index)

{
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  uint32_t local_24;
  char *pcStack_20;
  uint32_t index_local;
  char *prefix_local;
  BlockBuilder *this_local;
  
  local_24 = index;
  pcStack_20 = prefix;
  prefix_local = (char *)this;
  std::__cxx11::to_string(&local_68,index);
  std::operator+(&local_48,prefix,&local_68);
  this_local = (BlockBuilder *)createIdentifier<std::__cxx11::string>(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return (Identifier)(string *)this_local;
}

Assistant:

Identifier createIdentifier (const char* prefix, uint32_t index)    { return createIdentifier (prefix + std::to_string (index)); }